

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorLineEdit.cpp
# Opt level: O0

void __thiscall QColorLineEditPrivate::textEdited(QColorLineEditPrivate *this,QString *text)

{
  QIcon *pQVar1;
  bool bVar2;
  long in_RDI;
  QColor color;
  QString *in_stack_ffffffffffffff78;
  QColorAction *this_00;
  QColor *in_stack_ffffffffffffff80;
  QIcon local_40 [3];
  QIcon local_28;
  QColor *in_stack_ffffffffffffffe0;
  QColorAction *in_stack_ffffffffffffffe8;
  
  QColor::QColor(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar2 = QColor::isValid((QColor *)&stack0xffffffffffffffe0);
  if (bVar2) {
    pQVar1 = *(QIcon **)(in_RDI + 0x20);
    QColorAction::colorIcon(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    QAction::setIcon(pQVar1);
    QIcon::~QIcon(&local_28);
  }
  else {
    this_00 = *(QColorAction **)(in_RDI + 0x20);
    QColorAction::color(this_00);
    QColorAction::colorIcon(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    QAction::setIcon((QIcon *)this_00);
    QIcon::~QIcon(local_40);
  }
  return;
}

Assistant:

void textEdited(const QString &text) {
        const QColor color = QColor(text);

        if (color.isValid()) {
            action->setIcon(action->colorIcon(color));
        } else {
            action->setIcon(action->colorIcon(action->color()));
        }
    }